

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,IdentifierExpr *node)

{
  BuilderContext *pBVar1;
  shared_ptr<mocker::ir::Reg> dest;
  allocator<char> local_81;
  undefined1 local_80 [16];
  shared_ptr<mocker::ir::Reg> local_70 [2];
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  string local_40 [32];
  
  pBVar1 = this->ctx;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",&local_81);
  BuilderContext::makeTempLocalReg((BuilderContext *)local_80,(string *)pBVar1);
  std::__cxx11::string::~string((string *)local_70);
  pBVar1 = this->ctx;
  std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<mocker::ir::Reg,void>
            (local_50,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)local_80);
  BuilderContext::setExprAddr(pBVar1,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pBVar1 = this->ctx;
  std::__cxx11::string::string
            (local_40,(string *)
                      &((node->identifier).
                        super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->val);
  makeReg((Builder *)local_70,(string *)this);
  BuilderContext::
  emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
            (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_80,local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70[0].super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_40);
  BuilderContext::markExprTrivial(this->ctx,&node->super_Expression);
  BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  return;
}

Assistant:

void Builder::operator()(const ast::IdentifierExpr &node) const {
  auto dest = ctx.makeTempLocalReg();
  ctx.setExprAddr(node.getID(), dest);
  ctx.emplaceInst<Load>(dest, makeReg(node.identifier->val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}